

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::removeSecondColumnSingletonInDoubletonRow(HPresolve *this,int j,int i)

{
  vector<double,_std::allocator<double>_> *this_00;
  int *piVar1;
  double dVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  size_type __n;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int j_local;
  double local_48;
  undefined8 uStack_40;
  
  j_local = j;
  pvVar3 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).flagRow,(long)i);
  *pvVar3 = 0;
  pvVar6 = &(this->super_HPreData).colCost;
  __n = (size_type)j;
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar6,__n);
  if (*pvVar4 <= 0.0) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar6,__n);
    local_48 = *pvVar4;
    pvVar6 = &(this->super_HPreData).colUpper;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar6,__n);
    dVar2 = *pvVar4;
    if (local_48 < 0.0) {
      bVar7 = dVar2 == 1e+200;
      goto LAB_00142256;
    }
    if (0.0 <= dVar2) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).colLower,__n);
      uVar8 = 0;
      uVar9 = 0;
      if (*pvVar4 <= 0.0) goto LAB_00142304;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar6,__n);
    local_48 = ABS(*pvVar4);
    uStack_40 = 0;
    this_00 = &(this->super_HPreData).colLower;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
    if (ABS(*pvVar4) <= local_48) {
      pvVar6 = this_00;
    }
  }
  else {
    pvVar6 = &(this->super_HPreData).colLower;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar6,__n);
    dVar2 = *pvVar4;
    bVar7 = dVar2 == -1e+200;
LAB_00142256:
    if ((bVar7) && (!NAN(dVar2))) {
      if (0 < this->iPrint) {
        poVar5 = std::operator<<((ostream *)&std::cout,"PR: Problem unbounded.");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      this->status = 2;
      return;
    }
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar6,__n);
  uVar8 = SUB84(*pvVar4,0);
  uVar9 = (undefined4)((ulong)*pvVar4 >> 0x20);
LAB_00142304:
  setPrimalValue(this,j,(double)CONCAT44(uVar9,uVar8));
  addChange(this,0x14,0,j);
  if (0 < this->iPrint) {
    poVar5 = std::operator<<((ostream *)&std::cout,"PR: Second singleton column ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,j);
    poVar5 = std::operator<<(poVar5," in doubleton row ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,i);
    std::operator<<(poVar5," removed.\n");
  }
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 8;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::list<int,_std::allocator<int>_>::remove(&this->singCol,(char *)&j_local);
  return;
}

Assistant:

void HPresolve::removeSecondColumnSingletonInDoubletonRow(const int j, const int i) {
	// case two singleton columns
	// when we get here bounds on xj are updated so we can choose low/upper one
	// depending on the cost of xj
	flagRow.at(i) = 0;
	double value;
	if (colCost.at(j) > 0) {
		if (colLower.at(j) == -HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colLower.at(j);
	} else if (colCost.at(j) < 0) {
		if (colUpper.at(j) == HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colUpper.at(j);
	} else { //(colCost.at(j) == 0)
		if (colUpper.at(j) >= 0 && colLower.at(j) <= 0)
			value = 0;
		else if (abs(colUpper.at(j)) < abs(colLower.at(j)))
			value = colUpper.at(j);
		else
			value = colLower.at(j);
	}
	setPrimalValue(j, value);
	addChange(SING_COL_DOUBLETON_INEQ_SECOND_SING_COL, 0, j);
	if (iPrint > 0)
		cout << "PR: Second singleton column " << j << " in doubleton row " << i
				<< " removed.\n";
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	singCol.remove(j);
}